

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

char * run_len_encode(char *p,uint64_t i)

{
  uint64_t i_local;
  char *p_local;
  
  p_local = p;
  for (i_local = i; 0x7f < i_local; i_local = i_local >> 7) {
    *p_local = (byte)i_local & 0x7f | 0x80;
    p_local = p_local + 1;
  }
  *p_local = (byte)i_local & 0x7f;
  return p_local + 1;
}

Assistant:

inline char* run_len_encode(char* p, uint64_t i)
{
  // store an int 7 bits at a time.
  while (i >= 128)
  {
    *(p++) = (i & 127) | 128;
    i = i >> 7;
  }
  *(p++) = (i & 127);
  return p;
}